

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

void __thiscall
DLoadSaveMenu::DLoadSaveMenu(DLoadSaveMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DFrameBuffer *pDVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  DListMenu::DListMenu(&this->super_DListMenu,parent,desc);
  (this->super_DListMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_008654a8;
  ReadSaveStrings();
  this->savepicLeft = 10;
  iVar4 = CleanYfac;
  iVar8 = CleanYfac * 0x36;
  this->savepicTop = iVar8;
  pDVar5 = screen;
  iVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar3 = iVar7 * 0xd8 >> 0x1f;
  iVar6 = (iVar7 * 0xd8) / 0x280 + iVar3;
  iVar9 = iVar6 - iVar3;
  this->savepicWidth = iVar9;
  iVar1 = (pDVar5->super_DSimpleCanvas).super_DCanvas.Height;
  iVar2 = (iVar1 * 0x87) / 400;
  this->savepicHeight = iVar2;
  iVar10 = (SmallFont->FontHeight + 1) * iVar4;
  this->rowHeight = iVar10;
  this->listboxLeft = (iVar6 - iVar3) + 0x18;
  this->listboxTop = iVar8;
  this->listboxWidth = (iVar7 - iVar9) + -0x22;
  iVar6 = (iVar1 + iVar4 * -0x36 + -0xb) / iVar10;
  this->listboxRows = iVar6;
  iVar10 = iVar10 * iVar6;
  this->listboxHeight = iVar10 + 1;
  this->listboxRight = iVar7 + -10;
  this->listboxBottom = iVar10 + iVar8 + 1;
  this->commentLeft = 10;
  this->commentTop = iVar8 + iVar2 + 0x10;
  this->commentWidth = iVar9;
  iVar7 = 0x33;
  if (200 < iVar1) {
    iVar7 = 0x3d;
  }
  this->commentHeight = iVar7 * iVar4;
  this->commentRight = iVar9 + 10;
  this->commentBottom = iVar7 * iVar4 + iVar8 + iVar2 + 0x10;
  return;
}

Assistant:

DLoadSaveMenu::DLoadSaveMenu(DMenu *parent, FListMenuDescriptor *desc)
: DListMenu(parent, desc)
{
	ReadSaveStrings();

	savepicLeft = 10;
	savepicTop = 54*CleanYfac;
	savepicWidth = 216*screen->GetWidth()/640;
	savepicHeight = 135*screen->GetHeight()/400;

	rowHeight = (SmallFont->GetHeight() + 1) * CleanYfac;
	listboxLeft = savepicLeft + savepicWidth + 14;
	listboxTop = savepicTop;
	listboxWidth = screen->GetWidth() - listboxLeft - 10;
	int listboxHeight1 = screen->GetHeight() - listboxTop - 10;
	listboxRows = (listboxHeight1 - 1) / rowHeight;
	listboxHeight = listboxRows * rowHeight + 1;
	listboxRight = listboxLeft + listboxWidth;
	listboxBottom = listboxTop + listboxHeight;

	commentLeft = savepicLeft;
	commentTop = savepicTop + savepicHeight + 16;
	commentWidth = savepicWidth;
	commentHeight = (51+(screen->GetHeight()>200?10:0))*CleanYfac;
	commentRight = commentLeft + commentWidth;
	commentBottom = commentTop + commentHeight;
}